

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkIndexType Diligent::TypeToVkIndexType(VALUE_TYPE IndexType)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  VALUE_TYPE IndexType_local;
  
  if (IndexType == VT_UNDEFINED) {
    msg.field_2._12_4_ = 0x3b9d4e88;
  }
  else if (IndexType == VT_UINT16) {
    msg.field_2._12_4_ = 0;
  }
  else if (IndexType == VT_UINT32) {
    msg.field_2._12_4_ = 1;
  }
  else {
    msg.field_2._M_local_buf[0xb] = IndexType;
    FormatString<char[22]>((string *)local_30,(char (*) [22])"Unexpected index type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"TypeToVkIndexType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x291);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._12_4_ = 1;
  }
  return msg.field_2._12_4_;
}

Assistant:

VkIndexType TypeToVkIndexType(VALUE_TYPE IndexType)
{
    switch (IndexType)
    {
        // clang-format off
        case VT_UNDEFINED: return VK_INDEX_TYPE_NONE_KHR; // only for ray tracing
        case VT_UINT16:    return VK_INDEX_TYPE_UINT16;
        case VT_UINT32:    return VK_INDEX_TYPE_UINT32;
        // clang-format on
        default:
            UNEXPECTED("Unexpected index type");
            return VK_INDEX_TYPE_UINT32;
    }
}